

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SubqueryColumnTypes(Parse *pParse,Table *pTab,Select *pSelect,char aff)

{
  sqlite3 *db;
  ExprList *pEVar1;
  Expr *pExpr;
  char cVar2;
  char cVar3;
  uint uVar4;
  char *zIn;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  CollSeq *pCVar8;
  long lVar9;
  long lVar10;
  Select *pSVar11;
  uint uVar12;
  ulong uVar13;
  Column *pCol;
  Select *pSVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  NameContext sNC;
  undefined1 local_78 [32];
  undefined1 *local_58;
  undefined1 *puStack_50;
  Select *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  local_48 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if ((db->mallocFailed == '\0') && (pParse->eParseMode < 2)) {
    do {
      pSVar11 = pSelect;
      pSelect = pSVar11->pPrior;
    } while (pSVar11->pPrior != (Select *)0x0);
    pEVar1 = pSVar11->pEList;
    local_58 = (undefined1 *)0x0;
    puStack_50 = (undefined1 *)0x0;
    local_78._16_8_ = (ExprList *)0x0;
    local_78._24_8_ = (NameContext *)0x0;
    local_78._0_8_ = (Parse *)0x0;
    local_48 = (Select *)0x0;
    local_78._8_8_ = pSVar11->pSrc;
    if (0 < pTab->nCol) {
      pCol = pTab->aCol;
      lVar10 = 0;
      do {
        pTab->tabFlags = pTab->tabFlags | pCol->colFlags & 0x62;
        pExpr = pEVar1->a[lVar10].pExpr;
        cVar2 = sqlite3ExprAffinity(pExpr);
        pCol->affinity = cVar2;
        uVar12 = 0;
        pSVar14 = pSVar11;
        if (cVar2 < 'A') {
          if (pSVar11->pNext == (Select *)0x0) {
            uVar12 = 0;
          }
          else {
            uVar12 = 0;
            do {
              uVar4 = sqlite3ExprDataType(pSVar14->pEList->a[lVar10].pExpr);
              uVar12 = uVar4 | uVar12;
              pSVar14 = pSVar14->pNext;
              cVar2 = sqlite3ExprAffinity(pSVar14->pEList->a[lVar10].pExpr);
              pCol->affinity = cVar2;
              if ('@' < cVar2) goto LAB_00187206;
            } while (pSVar14->pNext != (Select *)0x0);
          }
          if (cVar2 < 'A') {
            pCol->affinity = aff;
          }
        }
LAB_00187206:
        if (('A' < pCol->affinity) && ((pSVar14 != pSVar11 || (pSVar14->pNext != (Select *)0x0)))) {
          while (pSVar14 = pSVar14->pNext, pSVar14 != (Select *)0x0) {
            uVar4 = sqlite3ExprDataType(pSVar14->pEList->a[lVar10].pExpr);
            uVar12 = uVar12 | uVar4;
          }
          if (((pCol->affinity == 'B') && ((uVar12 & 1) != 0)) ||
             (('B' < pCol->affinity && ((uVar12 & 2) != 0)))) {
            pCol->affinity = 'A';
          }
          if (('B' < pCol->affinity) && (pExpr->op == '$')) {
            pCol->affinity = 'F';
          }
        }
        zIn = columnTypeImpl((NameContext *)local_78,pExpr,(char **)0x0,(char **)0x0,(char **)0x0);
        if ((zIn == (char *)0x0) ||
           (cVar2 = pCol->affinity, cVar3 = sqlite3AffinityType(zIn,(Column *)0x0), cVar2 != cVar3))
        {
          cVar2 = pCol->affinity;
          zIn = "NUM";
          if ((cVar2 != 'C') && (zIn = "NUM", cVar2 != 'F')) {
            lVar9 = 1;
            do {
              if ("CADDEB"[lVar9] == cVar2) {
                zIn = sqlite3StdType[lVar9];
                goto LAB_001872d8;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 6);
            zIn = (char *)0x0;
          }
        }
LAB_001872d8:
        if (zIn != (char *)0x0) {
          sVar5 = strlen(zIn);
          pcVar7 = pCol->zCnName;
          if (pcVar7 == (char *)0x0) {
            uVar13 = 0;
          }
          else {
            sVar6 = strlen(pcVar7);
            uVar13 = (ulong)((uint)sVar6 & 0x3fffffff);
          }
          uVar15 = (ulong)((uint)sVar5 & 0x3fffffff);
          pcVar7 = (char *)sqlite3DbReallocOrFree(db,pcVar7,uVar15 + uVar13 + 2);
          pCol->zCnName = pcVar7;
          pCol->colFlags = pCol->colFlags & 0xfdfb;
          if (pcVar7 != (char *)0x0) {
            memcpy(pcVar7 + uVar13 + 1,zIn,uVar15 + 1);
            *(byte *)&pCol->colFlags = (byte)pCol->colFlags | 4;
          }
        }
        pCVar8 = sqlite3ExprCollSeq(pParse,pExpr);
        if (pCVar8 != (CollSeq *)0x0) {
          sqlite3ColumnSetColl(db,pCol,pCVar8->zName);
        }
        lVar10 = lVar10 + 1;
        pCol = pCol + 1;
      } while (lVar10 < pTab->nCol);
    }
    pTab->szTabRow = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SubqueryColumnTypes(
  Parse *pParse,      /* Parsing contexts */
  Table *pTab,        /* Add column type information to this table */
  Select *pSelect,    /* SELECT used to determine types and collations */
  char aff            /* Default affinity. */
){
  sqlite3 *db = pParse->db;
  Column *pCol;
  CollSeq *pColl;
  int i,j;
  Expr *p;
  struct ExprList_item *a;
  NameContext sNC;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || pParse->nErr>0 );
  assert( aff==SQLITE_AFF_NONE || aff==SQLITE_AFF_BLOB );
  if( db->mallocFailed || IN_RENAME_OBJECT ) return;
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  a = pSelect->pEList->a;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    i64 n;
    int m = 0;
    Select *pS2 = pSelect;
    pTab->tabFlags |= (pCol->colFlags & COLFLAG_NOINSERT);
    p = a[i].pExpr;
    /* pCol->szEst = ... // Column size est for SELECT tables never used */
    pCol->affinity = sqlite3ExprAffinity(p);
    while( pCol->affinity<=SQLITE_AFF_NONE && pS2->pNext!=0 ){
      m |= sqlite3ExprDataType(pS2->pEList->a[i].pExpr);
      pS2 = pS2->pNext;
      pCol->affinity = sqlite3ExprAffinity(pS2->pEList->a[i].pExpr);
    }
    if( pCol->affinity<=SQLITE_AFF_NONE ){
      pCol->affinity = aff;
    }
    if( pCol->affinity>=SQLITE_AFF_TEXT && (pS2->pNext || pS2!=pSelect) ){
      for(pS2=pS2->pNext; pS2; pS2=pS2->pNext){
        m |= sqlite3ExprDataType(pS2->pEList->a[i].pExpr);
      }
      if( pCol->affinity==SQLITE_AFF_TEXT && (m&0x01)!=0 ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }else
      if( pCol->affinity>=SQLITE_AFF_NUMERIC && (m&0x02)!=0 ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }
      if( pCol->affinity>=SQLITE_AFF_NUMERIC && p->op==TK_CAST ){
        pCol->affinity = SQLITE_AFF_FLEXNUM;
      }
    }
    zType = columnType(&sNC, p, 0, 0, 0);
    if( zType==0 || pCol->affinity!=sqlite3AffinityType(zType, 0) ){
      if( pCol->affinity==SQLITE_AFF_NUMERIC
       || pCol->affinity==SQLITE_AFF_FLEXNUM
      ){
        zType = "NUM";
      }else{
        zType = 0;
        for(j=1; j<SQLITE_N_STDTYPE; j++){
          if( sqlite3StdTypeAffinity[j]==pCol->affinity ){
            zType = sqlite3StdType[j];
            break;
          }
        }
      }
    }
    if( zType ){
      const i64 k = sqlite3Strlen30(zType);
      n = sqlite3Strlen30(pCol->zCnName);
      pCol->zCnName = sqlite3DbReallocOrFree(db, pCol->zCnName, n+k+2);
      pCol->colFlags &= ~(COLFLAG_HASTYPE|COLFLAG_HASCOLL);
      if( pCol->zCnName ){
        memcpy(&pCol->zCnName[n+1], zType, k+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }
    }
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl ){
      assert( pTab->pIndex==0 );
      sqlite3ColumnSetColl(db, pCol, pColl->zName);
    }
  }
  pTab->szTabRow = 1; /* Any non-zero value works */
}